

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Padding_x86_avx::forward(Padding_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  undefined4 uVar2;
  uint uVar3;
  int *piVar4;
  int *piVar5;
  __m256 v;
  __m256 v_00;
  __m256 v_01;
  __m256 v_02;
  int iVar6;
  sbyte sVar7;
  uint uVar8;
  _func_int **pp_Var9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  undefined1 (*pauVar15) [32];
  undefined1 (*pauVar16) [16];
  ulong uVar17;
  _func_int *p_Var18;
  undefined1 (*pauVar19) [32];
  undefined1 (*pauVar20) [16];
  Mat *pMVar21;
  uint uVar22;
  Mat *pMVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  undefined1 (*pauVar30) [32];
  undefined1 (*pauVar31) [16];
  int iVar32;
  uint uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined8 in_XMM1_Qa;
  __m128 v_03;
  __m128 v_04;
  __m128 v_05;
  __m128 v_06;
  Mat m;
  Option opt_pack1;
  undefined8 in_stack_fffffffffffffee0;
  Allocator *pAVar38;
  Padding_x86_avx *pPVar39;
  Padding_x86_avx *pPVar40;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  void *in_stack_fffffffffffffef8;
  void *__ptr;
  undefined8 local_98;
  Option local_78;
  
  p_Var18 = this->_vptr_Padding_x86_avx[-3];
  uVar22 = *(uint *)(&this->field_0xd0 + (long)p_Var18);
  if (((((uVar22 == 0) && (*(int *)(&this->field_0xd4 + (long)p_Var18) == 0)) &&
       (*(int *)(&this->field_0xd8 + (long)p_Var18) == 0)) &&
      ((*(int *)(&this->field_0xdc + (long)p_Var18) == 0 &&
       (*(int *)(&this->field_0xe8 + (long)p_Var18) == 0)))) &&
     (*(int *)(&this->field_0xec + (long)p_Var18) == 0)) {
    if (top_blob != bottom_blob) {
      piVar4 = bottom_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = top_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar4 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar4;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar6 = bottom_blob->w;
      iVar32 = bottom_blob->h;
      iVar24 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar6;
      top_blob->h = iVar32;
      top_blob->d = iVar24;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    return 0;
  }
  iVar6 = bottom_blob->elempack;
  uVar13 = bottom_blob->elemsize;
  if (iVar6 != 0) {
    if (((int)uVar13 * 8) / iVar6 == 8) {
      iVar6 = forward_int8(this,bottom_blob,top_blob,opt);
      return iVar6;
    }
    iVar32 = bottom_blob->w;
    iVar24 = bottom_blob->h;
    iVar27 = bottom_blob->d;
    uVar25 = bottom_blob->c;
    if (iVar6 == 4) {
      switch(bottom_blob->dims) {
      case 1:
        uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var18) + iVar32 * 4 +
                 *(int *)(&this->field_0xdc + (long)p_Var18);
        sVar7 = 3;
        if ((uVar22 & 7) != 0) {
          sVar7 = ((uVar22 & 3) == 0) * '\x02';
        }
        if ((((*(uint *)(&this->field_0xd8 + (long)p_Var18) & 3) == 0) && ((uVar22 & 7) == 4)) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var18) == 0)) {
          Mat::create(top_blob,(int)uVar22 >> 2,(uVar13 >> 2) << sVar7,4,opt->blob_allocator);
          if ((Mat *)top_blob->data == (Mat *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            p_Var18 = this->_vptr_Padding_x86_avx[-3];
            iVar6 = *(int *)(&this->field_0xd8 + (long)p_Var18);
            iVar32 = iVar6 + 3;
            if (-1 < iVar6) {
              iVar32 = iVar6;
            }
            v_03[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var18);
            v_03[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var18);
            iVar6 = *(int *)(&this->field_0xdc + (long)p_Var18);
            iVar24 = iVar6 + 3;
            if (-1 < iVar6) {
              iVar24 = iVar6;
            }
            v_03[2] = (float)(int)in_XMM1_Qa;
            v_03[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
            padding_constant_pack4_sse
                      ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,0,0
                       ,iVar32 >> 2,iVar24 >> 2,v_03);
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        uVar25 = uVar22 + iVar24 * 4 + *(int *)(&this->field_0xd4 + (long)p_Var18);
        sVar7 = 3;
        if ((uVar25 & 7) != 0) {
          sVar7 = ((uVar25 & 3) == 0) * '\x02';
        }
        if ((((uVar22 & 3) == 0) && ((uVar25 & 7) == 4)) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var18) == 0)) {
          Mat::create(top_blob,iVar32 + *(int *)(&this->field_0xd8 + (long)p_Var18) +
                               *(int *)(&this->field_0xdc + (long)p_Var18),(int)uVar25 >> 2,
                      (uVar13 >> 2) << sVar7,4,opt->blob_allocator);
          if ((Mat *)top_blob->data == (Mat *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            p_Var18 = this->_vptr_Padding_x86_avx[-3];
            v_06[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var18);
            v_06[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var18);
            iVar6 = *(int *)(&this->field_0xd0 + (long)p_Var18);
            iVar32 = *(int *)(&this->field_0xd4 + (long)p_Var18);
            iVar24 = iVar6 + 3;
            if (-1 < iVar6) {
              iVar24 = iVar6;
            }
            iVar6 = iVar32 + 3;
            if (-1 < iVar32) {
              iVar6 = iVar32;
            }
            v_06[2] = (float)(int)in_XMM1_Qa;
            v_06[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
            padding_constant_pack4_sse
                      ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,
                       iVar24 >> 2,iVar6 >> 2,*(int *)(&this->field_0xd8 + (long)p_Var18),
                       *(int *)(&this->field_0xdc + (long)p_Var18),v_06);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        uVar8 = *(uint *)(&this->field_0xe8 + (long)p_Var18) + uVar25 * 4 +
                *(int *)(&this->field_0xec + (long)p_Var18);
        sVar7 = ((uVar8 & 3) == 0) * '\x02';
        if ((uVar8 & 7) == 0) {
          sVar7 = 3;
        }
        if (((*(uint *)(&this->field_0xe8 + (long)p_Var18) & 3) == 0) && ((uVar8 & 7) == 4)) {
          if ((uVar8 == uVar25 * 4) || (*(int *)(&this->field_0xe0 + (long)p_Var18) == 0)) {
            uVar8 = (int)uVar8 >> 2;
            Mat::create(top_blob,iVar32 + *(int *)(&this->field_0xd8 + (long)p_Var18) +
                                 *(int *)(&this->field_0xdc + (long)p_Var18),
                        uVar22 + iVar24 + *(int *)(&this->field_0xd4 + (long)p_Var18),uVar8,
                        (uVar13 >> 2) << sVar7,4,opt->blob_allocator);
            if (top_blob->data == (void *)0x0) {
              return -100;
            }
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar6 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx[-3]);
              iVar32 = iVar6 + 3;
              if (-1 < iVar6) {
                iVar32 = iVar6;
              }
              if ((int)uVar8 < 1) {
                return 0;
              }
              iVar32 = -(iVar32 >> 2);
              uVar13 = 0;
              iVar6 = iVar32;
              do {
                uVar10 = top_blob->elemsize;
                uVar11 = (long)top_blob->h * (long)top_blob->w;
                uVar17 = (uVar10 * uVar11 + 0xf & 0xfffffffffffffff0) / uVar10;
                if (top_blob->dims == 4) {
                  uVar17 = uVar11;
                }
                pp_Var9 = this->_vptr_Padding_x86_avx;
                p_Var18 = pp_Var9[-3];
                if (*(int *)(&this->field_0xf0 + (long)p_Var18) == 0) {
                  uVar2 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var18);
                  auVar34._4_4_ = uVar2;
                  auVar34._0_4_ = uVar2;
                  auVar34._8_4_ = uVar2;
                  auVar34._12_4_ = uVar2;
                }
                else {
                  auVar34 = *(undefined1 (*) [16])
                             (*(long *)(&this->field_0xf8 + (long)p_Var18) + uVar13 * 0x10);
                }
                pMVar21 = (Mat *)(top_blob->cstep * uVar13 * uVar10 + (long)top_blob->data);
                uVar22 = iVar32 + (int)uVar13;
                if ((int)uVar22 < 0 || (int)uVar25 <= (int)uVar22) {
                  iVar24 = (int)uVar17 * top_blob->d;
                  if (0 < iVar24) {
                    do {
                      pMVar21->data = (void *)auVar34._0_8_;
                      pMVar21->refcount = (int *)auVar34._8_8_;
                      pMVar21 = (Mat *)&pMVar21->elemsize;
                      iVar24 = iVar24 + -1;
                    } while (iVar24 != 0);
                  }
                }
                else {
                  uVar33 = bottom_blob->w;
                  iVar24 = bottom_blob->h;
                  pauVar16 = (undefined1 (*) [16])
                             ((ulong)uVar22 * bottom_blob->cstep * bottom_blob->elemsize +
                             (long)bottom_blob->data);
                  iVar27 = *(int *)(&this->field_0xe0 + (long)p_Var18);
                  iVar32 = iVar6;
                  pauVar20 = pauVar16;
                  if (iVar27 == 0) {
                    v_04._0_8_ = auVar34._0_8_;
                    v_04[2] = (float)(int)in_XMM1_Qa;
                    v_04[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
                    pPVar39 = this;
                    padding_constant_pack4_sse
                              ((ncnn *)&stack0xfffffffffffffef8,pMVar21,
                               (Mat *)(ulong)(uint)top_blob->w,
                               *(int *)(&this->field_0xd0 + (long)p_Var18),
                               *(int *)(&this->field_0xd4 + (long)p_Var18),
                               *(int *)(&this->field_0xd8 + (long)p_Var18),
                               *(int *)(&this->field_0xdc + (long)p_Var18),v_04);
                    pp_Var9 = this->_vptr_Padding_x86_avx;
                    p_Var18 = pp_Var9[-3];
                    iVar27 = *(int *)(&this->field_0xe0 + (long)p_Var18);
                    this = pPVar39;
                    iVar32 = iVar6;
                  }
                  if (iVar27 == 1) {
                    iVar6 = *(int *)(&this->field_0xd0 + (long)p_Var18);
                    iVar27 = *(int *)(&this->field_0xd4 + (long)p_Var18);
                    iVar29 = *(int *)(&this->field_0xd8 + (long)p_Var18);
                    iVar14 = *(int *)(&this->field_0xdc + (long)p_Var18);
                    pMVar23 = pMVar21;
                    if (0 < iVar6) {
                      iVar26 = 0;
                      do {
                        auVar35 = *pauVar16;
                        iVar28 = iVar29;
                        if (0 < iVar29) {
                          do {
                            pMVar23->data = (void *)auVar35._0_8_;
                            pMVar23->refcount = (int *)auVar35._8_8_;
                            pMVar23 = (Mat *)&pMVar23->elemsize;
                            iVar28 = iVar28 + -1;
                          } while (iVar28 != 0);
                        }
                        if (0 < (int)uVar33) {
                          iVar28 = 0;
                          pauVar31 = pauVar16;
                          do {
                            auVar35 = *pauVar31;
                            pMVar23->data = (void *)auVar35._0_8_;
                            pMVar23->refcount = (int *)auVar35._8_8_;
                            pauVar31 = pauVar31 + 1;
                            pMVar23 = (Mat *)&pMVar23->elemsize;
                            iVar28 = iVar28 + 1;
                          } while (iVar28 < (int)uVar33);
                        }
                        iVar28 = iVar14;
                        if (0 < iVar14) {
                          do {
                            pMVar23->data = (void *)auVar35._0_8_;
                            pMVar23->refcount = (int *)auVar35._8_8_;
                            pMVar23 = (Mat *)&pMVar23->elemsize;
                            iVar28 = iVar28 + -1;
                          } while (iVar28 != 0);
                        }
                        iVar26 = iVar26 + 1;
                      } while (iVar26 != iVar6);
                    }
                    if (0 < iVar24) {
                      iVar6 = 0;
                      do {
                        auVar35 = *pauVar16;
                        iVar26 = iVar29;
                        if (0 < iVar29) {
                          do {
                            pMVar23->data = (void *)auVar35._0_8_;
                            pMVar23->refcount = (int *)auVar35._8_8_;
                            pMVar23 = (Mat *)&pMVar23->elemsize;
                            iVar26 = iVar26 + -1;
                          } while (iVar26 != 0);
                        }
                        if (0 < (int)uVar33) {
                          iVar26 = 0;
                          do {
                            auVar35 = *pauVar16;
                            pMVar23->data = (void *)auVar35._0_8_;
                            pMVar23->refcount = (int *)auVar35._8_8_;
                            pauVar16 = pauVar16 + 1;
                            pMVar23 = (Mat *)&pMVar23->elemsize;
                            iVar26 = iVar26 + 1;
                          } while (iVar26 < (int)uVar33);
                        }
                        iVar26 = iVar14;
                        if (0 < iVar14) {
                          do {
                            pMVar23->data = (void *)auVar35._0_8_;
                            pMVar23->refcount = (int *)auVar35._8_8_;
                            pMVar23 = (Mat *)&pMVar23->elemsize;
                            iVar26 = iVar26 + -1;
                          } while (iVar26 != 0);
                        }
                        iVar6 = iVar6 + 1;
                      } while (iVar6 < iVar24);
                    }
                    if (0 < iVar27) {
                      iVar6 = 0;
                      do {
                        auVar35 = pauVar16[-(long)(int)uVar33];
                        iVar26 = iVar29;
                        if (0 < iVar29) {
                          do {
                            pMVar23->data = (void *)auVar35._0_8_;
                            pMVar23->refcount = (int *)auVar35._8_8_;
                            pMVar23 = (Mat *)&pMVar23->elemsize;
                            iVar26 = iVar26 + -1;
                          } while (iVar26 != 0);
                        }
                        if (0 < (int)uVar33) {
                          iVar26 = 0;
                          pauVar31 = pauVar16 + -(long)(int)uVar33;
                          do {
                            auVar35 = *pauVar31;
                            pMVar23->data = (void *)auVar35._0_8_;
                            pMVar23->refcount = (int *)auVar35._8_8_;
                            pauVar31 = pauVar31 + 1;
                            pMVar23 = (Mat *)&pMVar23->elemsize;
                            iVar26 = iVar26 + 1;
                          } while (iVar26 < (int)uVar33);
                        }
                        iVar26 = iVar14;
                        if (0 < iVar14) {
                          do {
                            pMVar23->data = (void *)auVar35._0_8_;
                            pMVar23->refcount = (int *)auVar35._8_8_;
                            pMVar23 = (Mat *)&pMVar23->elemsize;
                            iVar26 = iVar26 + -1;
                          } while (iVar26 != 0);
                        }
                        iVar6 = iVar6 + 1;
                      } while (iVar6 != iVar27);
                    }
                  }
                  p_Var18 = pp_Var9[-3];
                  iVar6 = iVar32;
                  if (*(int *)(&this->field_0xe0 + (long)p_Var18) == 2) {
                    iVar27 = *(int *)(&this->field_0xd0 + (long)p_Var18);
                    iVar29 = *(int *)(&this->field_0xd4 + (long)p_Var18);
                    uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var18);
                    uVar10 = (ulong)uVar22;
                    uVar3 = *(uint *)(&this->field_0xdc + (long)p_Var18);
                    uVar17 = (ulong)uVar3;
                    pauVar20 = (undefined1 (*) [16])
                               (*pauVar20 + (long)(int)(iVar27 * uVar33 * 4) * 4);
                    if (0 < iVar27) {
                      iVar14 = 0;
                      do {
                        lVar12 = uVar10 << 4;
                        if (0 < (int)uVar22) {
                          do {
                            *(undefined1 (*) [16])pMVar21 =
                                 *(undefined1 (*) [16])(*pauVar20 + lVar12);
                            pMVar21 = (Mat *)&pMVar21->elemsize;
                            lVar12 = lVar12 + -0x10;
                          } while (lVar12 != 0);
                        }
                        pauVar16 = pauVar20;
                        if (0 < (int)uVar33) {
                          iVar26 = 0;
                          do {
                            *(undefined1 (*) [16])pMVar21 = *pauVar16;
                            pauVar16 = pauVar16 + 1;
                            pMVar21 = (Mat *)&pMVar21->elemsize;
                            iVar26 = iVar26 + 1;
                          } while (iVar26 < (int)uVar33);
                        }
                        if (0 < (int)uVar3) {
                          lVar12 = -0x20;
                          do {
                            *(undefined1 (*) [16])pMVar21 =
                                 *(undefined1 (*) [16])(*pauVar16 + lVar12);
                            pMVar21 = (Mat *)&pMVar21->elemsize;
                            lVar1 = uVar17 * 0x10 + lVar12;
                            lVar12 = lVar12 + -0x10;
                          } while (lVar1 != -0x10);
                        }
                        pauVar20 = (undefined1 (*) [16])
                                   ((long)pauVar20 + (long)(int)(uVar33 * 4) * -4);
                        iVar14 = iVar14 + 1;
                      } while (iVar14 != iVar27);
                    }
                    if (0 < iVar24) {
                      iVar27 = 0;
                      do {
                        lVar12 = uVar10 << 4;
                        if (0 < (int)uVar22) {
                          do {
                            *(undefined1 (*) [16])pMVar21 =
                                 *(undefined1 (*) [16])(*pauVar20 + lVar12);
                            pMVar21 = (Mat *)&pMVar21->elemsize;
                            lVar12 = lVar12 + -0x10;
                          } while (lVar12 != 0);
                        }
                        if (0 < (int)uVar33) {
                          iVar14 = 0;
                          do {
                            *(undefined1 (*) [16])pMVar21 = *pauVar20;
                            pauVar20 = pauVar20 + 1;
                            pMVar21 = (Mat *)&pMVar21->elemsize;
                            iVar14 = iVar14 + 1;
                          } while (iVar14 < (int)uVar33);
                        }
                        if (0 < (int)uVar3) {
                          lVar12 = -0x20;
                          do {
                            *(undefined1 (*) [16])pMVar21 =
                                 *(undefined1 (*) [16])(*pauVar20 + lVar12);
                            pMVar21 = (Mat *)&pMVar21->elemsize;
                            lVar1 = uVar17 * 0x10 + lVar12;
                            lVar12 = lVar12 + -0x10;
                          } while (lVar1 != -0x10);
                        }
                        iVar27 = iVar27 + 1;
                      } while (iVar27 < iVar24);
                    }
                    if (0 < iVar29) {
                      uVar11 = (ulong)(int)uVar33;
                      pauVar20 = pauVar20 + uVar11 * -2;
                      iVar24 = 0;
                      do {
                        lVar12 = uVar10 << 4;
                        if (0 < (int)uVar22) {
                          do {
                            *(undefined1 (*) [16])pMVar21 =
                                 *(undefined1 (*) [16])(*pauVar20 + lVar12);
                            pMVar21 = (Mat *)&pMVar21->elemsize;
                            lVar12 = lVar12 + -0x10;
                          } while (lVar12 != 0);
                          uVar11 = (ulong)uVar33;
                        }
                        pauVar16 = pauVar20;
                        if (0 < (int)uVar11) {
                          iVar27 = 0;
                          do {
                            *(undefined1 (*) [16])pMVar21 = *pauVar16;
                            pauVar16 = pauVar16 + 1;
                            pMVar21 = (Mat *)&pMVar21->elemsize;
                            iVar27 = iVar27 + 1;
                            uVar11 = (ulong)uVar33;
                          } while (iVar27 < (int)uVar33);
                        }
                        if (0 < (int)uVar3) {
                          lVar12 = -0x20;
                          do {
                            *(undefined1 (*) [16])pMVar21 =
                                 *(undefined1 (*) [16])(*pauVar16 + lVar12);
                            pMVar21 = (Mat *)&pMVar21->elemsize;
                            lVar1 = uVar17 * 0x10 + lVar12;
                            lVar12 = lVar12 + -0x10;
                          } while (lVar1 != -0x10);
                          uVar11 = (ulong)uVar33;
                        }
                        pauVar20 = (undefined1 (*) [16])
                                   ((long)pauVar20 + (long)((int)uVar11 * 4) * -4);
                        iVar24 = iVar24 + 1;
                      } while (iVar24 != iVar29);
                    }
                  }
                }
                uVar13 = uVar13 + 1;
              } while (uVar13 != uVar8);
              return 0;
            }
            return -100;
          }
        }
        break;
      case 4:
        if (*(int *)(&this->field_0xe0 + (long)p_Var18) == 0) {
          uVar8 = *(int *)(&this->field_0xe8 + (long)p_Var18) + iVar27 +
                  *(int *)(&this->field_0xec + (long)p_Var18);
          Mat::create(top_blob,iVar32 + *(int *)(&this->field_0xd8 + (long)p_Var18) +
                               *(int *)(&this->field_0xdc + (long)p_Var18),
                      uVar22 + iVar24 + *(int *)(&this->field_0xd4 + (long)p_Var18),uVar8,uVar25,
                      uVar13,4,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            if ((int)uVar25 < 1) {
              return 0;
            }
            uVar10 = (ulong)uVar8;
            uVar13 = 0;
            do {
              p_Var18 = this->_vptr_Padding_x86_avx[-3];
              if (*(int *)(&this->field_0xf0 + (long)p_Var18) == 0) {
                uVar2 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var18);
                auVar35._4_4_ = uVar2;
                auVar35._0_4_ = uVar2;
                auVar35._8_4_ = uVar2;
                auVar35._12_4_ = uVar2;
              }
              else {
                auVar35 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0xf8 + (long)p_Var18) + uVar13 * 0x10);
              }
              pPVar39 = this;
              if (0 < (int)uVar8) {
                uVar17 = 0;
                do {
                  uVar11 = (long)top_blob->h * (long)top_blob->w;
                  pMVar21 = (Mat *)((long)top_blob->data +
                                   top_blob->elemsize * uVar17 * uVar11 +
                                   top_blob->cstep * uVar13 * top_blob->elemsize);
                  p_Var18 = this->_vptr_Padding_x86_avx[-3];
                  iVar6 = (int)uVar17 - *(int *)(&this->field_0xe8 + (long)p_Var18);
                  if (iVar6 < 0 || iVar27 <= iVar6) {
                    if (0 < (int)uVar11) {
                      do {
                        pMVar21->data = (void *)auVar35._0_8_;
                        pMVar21->refcount = (int *)auVar35._8_8_;
                        pMVar21 = (Mat *)&pMVar21->elemsize;
                        uVar22 = (int)uVar11 - 1;
                        uVar11 = (ulong)uVar22;
                      } while (uVar22 != 0);
                    }
                  }
                  else {
                    local_98 = auVar35._0_8_;
                    v_05[2] = (float)(int)in_XMM1_Qa;
                    v_05[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
                    v_05[0] = (float)(undefined4)local_98;
                    v_05[1] = (float)local_98._4_4_;
                    pPVar40 = pPVar39;
                    padding_constant_pack4_sse
                              ((ncnn *)&stack0xfffffffffffffef8,pMVar21,(Mat *)(long)top_blob->w,
                               *(int *)(&pPVar39->field_0xd0 + (long)p_Var18),
                               *(int *)(&pPVar39->field_0xd4 + (long)p_Var18),
                               *(int *)(&pPVar39->field_0xd8 + (long)p_Var18),
                               *(int *)(&pPVar39->field_0xdc + (long)p_Var18),v_05);
                    this = pPVar39;
                    pPVar39 = pPVar40;
                  }
                  uVar17 = uVar17 + 1;
                } while (uVar17 != uVar10);
              }
              uVar13 = uVar13 + 1;
              this = pPVar39;
            } while (uVar13 != uVar25);
            return 0;
          }
          return -100;
        }
      }
    }
    else if (iVar6 == 8) {
      switch(bottom_blob->dims) {
      case 1:
        uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var18) + iVar32 * 8 +
                 *(int *)(&this->field_0xdc + (long)p_Var18);
        sVar7 = 3;
        if ((uVar22 & 7) != 0) {
          sVar7 = ((uVar22 & 3) == 0) * '\x02';
        }
        if ((((*(uint *)(&this->field_0xd8 + (long)p_Var18) | uVar22) & 7) == 0) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var18) == 0)) {
          uVar25 = uVar22 + 7;
          if (-1 < (int)uVar22) {
            uVar25 = uVar22;
          }
          Mat::create(top_blob,(int)uVar25 >> 3,(uVar13 >> 3) << sVar7,8,opt->blob_allocator);
          if ((Mat *)top_blob->data != (Mat *)0x0) {
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar6 = *(int *)(&this->field_0xd8 + (long)this->_vptr_Padding_x86_avx[-3]);
              iVar32 = iVar6 + 7;
              if (-1 < iVar6) {
                iVar32 = iVar6;
              }
              iVar6 = *(int *)(&this->field_0xdc + (long)this->_vptr_Padding_x86_avx[-3]);
              iVar24 = iVar6 + 7;
              if (-1 < iVar6) {
                iVar24 = iVar6;
              }
              v._8_8_ = this;
              v[0] = (float)(int)in_stack_fffffffffffffee0;
              v[1] = (float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
              v[4] = (float)in_stack_fffffffffffffef0;
              v[5] = (float)in_stack_fffffffffffffef4;
              v._24_8_ = in_stack_fffffffffffffef8;
              padding_constant_pack8_avx
                        ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,0
                         ,0,iVar32 >> 3,iVar24 >> 3,v);
              return 0;
            }
            return -100;
          }
          return -100;
        }
        break;
      case 2:
        uVar25 = uVar22 + iVar24 * 8 + *(int *)(&this->field_0xd4 + (long)p_Var18);
        sVar7 = 3;
        if ((uVar25 & 7) != 0) {
          sVar7 = ((uVar25 & 3) == 0) * '\x02';
        }
        if ((((uVar22 | uVar25) & 7) == 0) && (*(int *)(&this->field_0xe0 + (long)p_Var18) == 0)) {
          uVar22 = uVar25 + 7;
          if (-1 < (int)uVar25) {
            uVar22 = uVar25;
          }
          Mat::create(top_blob,iVar32 + *(int *)(&this->field_0xd8 + (long)p_Var18) +
                               *(int *)(&this->field_0xdc + (long)p_Var18),(int)uVar22 >> 3,
                      (uVar13 >> 3) << sVar7,8,opt->blob_allocator);
          if ((Mat *)top_blob->data != (Mat *)0x0) {
            if ((long)top_blob->c * top_blob->cstep != 0) {
              p_Var18 = this->_vptr_Padding_x86_avx[-3];
              iVar6 = *(int *)(&this->field_0xd0 + (long)p_Var18);
              iVar32 = *(int *)(&this->field_0xd4 + (long)p_Var18);
              iVar24 = iVar6 + 7;
              if (-1 < iVar6) {
                iVar24 = iVar6;
              }
              iVar6 = iVar32 + 7;
              if (-1 < iVar32) {
                iVar6 = iVar32;
              }
              v_02._8_8_ = this;
              v_02[0] = (float)(int)in_stack_fffffffffffffee0;
              v_02[1] = (float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
              v_02[4] = (float)in_stack_fffffffffffffef0;
              v_02[5] = (float)in_stack_fffffffffffffef4;
              v_02._24_8_ = in_stack_fffffffffffffef8;
              padding_constant_pack8_avx
                        ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,
                         iVar24 >> 3,iVar6 >> 3,*(int *)(&this->field_0xd8 + (long)p_Var18),
                         *(int *)(&this->field_0xdc + (long)p_Var18),v_02);
              return 0;
            }
            return -100;
          }
          return -100;
        }
        break;
      case 3:
        uVar8 = *(uint *)(&this->field_0xe8 + (long)p_Var18) + uVar25 * 8 +
                *(int *)(&this->field_0xec + (long)p_Var18);
        sVar7 = ((uVar8 & 3) == 0) * '\x02';
        if ((uVar8 & 7) == 0) {
          sVar7 = 3;
        }
        if (((*(uint *)(&this->field_0xe8 + (long)p_Var18) | uVar8) & 7) == 0) {
          if ((uVar8 == uVar25 * 8) || (*(int *)(&this->field_0xe0 + (long)p_Var18) == 0)) {
            uVar33 = uVar8 + 7;
            if (-1 < (int)uVar8) {
              uVar33 = uVar8;
            }
            Mat::create(top_blob,iVar32 + *(int *)(&this->field_0xd8 + (long)p_Var18) +
                                 *(int *)(&this->field_0xdc + (long)p_Var18),
                        uVar22 + iVar24 + *(int *)(&this->field_0xd4 + (long)p_Var18),
                        (int)uVar33 >> 3,(uVar13 >> 3) << sVar7,8,opt->blob_allocator);
            if (top_blob->data == (void *)0x0) {
              return -100;
            }
            if ((long)top_blob->c * top_blob->cstep == 0) {
              return -100;
            }
            iVar6 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx[-3]);
            iVar32 = iVar6 + 7;
            if (-1 < iVar6) {
              iVar32 = iVar6;
            }
            if ((int)uVar8 < 8) {
              return 0;
            }
            uVar13 = 0;
            do {
              uVar10 = top_blob->elemsize;
              uVar11 = (long)top_blob->h * (long)top_blob->w;
              uVar17 = (uVar10 * uVar11 + 0xf & 0xfffffffffffffff0) / uVar10;
              if (top_blob->dims == 4) {
                uVar17 = uVar11;
              }
              pp_Var9 = this->_vptr_Padding_x86_avx;
              p_Var18 = pp_Var9[-3];
              if (*(int *)(&this->field_0xf0 + (long)p_Var18) == 0) {
                uVar2 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var18);
                auVar36._4_4_ = uVar2;
                auVar36._0_4_ = uVar2;
                auVar36._8_4_ = uVar2;
                auVar36._12_4_ = uVar2;
                auVar36._16_4_ = uVar2;
                auVar36._20_4_ = uVar2;
                auVar36._24_4_ = uVar2;
                auVar36._28_4_ = uVar2;
              }
              else {
                auVar36 = *(undefined1 (*) [32])
                           (*(long *)(&this->field_0xf8 + (long)p_Var18) + uVar13 * 0x20);
              }
              pMVar21 = (Mat *)(top_blob->cstep * uVar13 * uVar10 + (long)top_blob->data);
              uVar22 = (int)uVar13 - (iVar32 >> 3);
              if ((int)uVar22 < 0 || (int)uVar25 <= (int)uVar22) {
                iVar6 = (int)uVar17 * top_blob->d;
                if (0 < iVar6) {
                  do {
                    pMVar21->data = (void *)auVar36._0_8_;
                    pMVar21->refcount = (int *)auVar36._8_8_;
                    pMVar21->elemsize = auVar36._16_8_;
                    pMVar21->elempack = auVar36._24_4_;
                    *(int *)&pMVar21->field_0x1c = auVar36._28_4_;
                    pMVar21 = (Mat *)&pMVar21->allocator;
                    iVar6 = iVar6 + -1;
                  } while (iVar6 != 0);
                }
              }
              else {
                uVar8 = bottom_blob->w;
                iVar6 = bottom_blob->h;
                pauVar15 = (undefined1 (*) [32])
                           ((ulong)uVar22 * bottom_blob->cstep * bottom_blob->elemsize +
                           (long)bottom_blob->data);
                iVar24 = *(int *)(&this->field_0xe0 + (long)p_Var18);
                pauVar19 = pauVar15;
                if (iVar24 == 0) {
                  v_00._8_8_ = this;
                  v_00[0] = (float)(int)in_stack_fffffffffffffee0;
                  v_00[1] = (float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
                  v_00[4] = (float)in_stack_fffffffffffffef0;
                  v_00[5] = (float)in_stack_fffffffffffffef4;
                  v_00._24_8_ = pauVar15;
                  pPVar39 = this;
                  padding_constant_pack8_avx
                            ((ncnn *)&stack0xfffffffffffffef8,pMVar21,
                             (Mat *)(ulong)(uint)top_blob->w,
                             *(int *)(&this->field_0xd0 + (long)p_Var18),
                             *(int *)(&this->field_0xd4 + (long)p_Var18),
                             *(int *)(&this->field_0xd8 + (long)p_Var18),
                             *(int *)(&this->field_0xdc + (long)p_Var18),v_00);
                  pp_Var9 = this->_vptr_Padding_x86_avx;
                  p_Var18 = pp_Var9[-3];
                  iVar24 = *(int *)(&this->field_0xe0 + (long)p_Var18);
                  this = pPVar39;
                }
                if (iVar24 == 1) {
                  iVar24 = *(int *)(&this->field_0xd0 + (long)p_Var18);
                  iVar27 = *(int *)(&this->field_0xd4 + (long)p_Var18);
                  iVar29 = *(int *)(&this->field_0xd8 + (long)p_Var18);
                  iVar14 = *(int *)(&this->field_0xdc + (long)p_Var18);
                  pMVar23 = pMVar21;
                  if (0 < iVar24) {
                    iVar26 = 0;
                    do {
                      auVar37 = *pauVar15;
                      iVar28 = iVar29;
                      if (0 < iVar29) {
                        do {
                          pMVar23->data = (void *)auVar37._0_8_;
                          pMVar23->refcount = (int *)auVar37._8_8_;
                          pMVar23->elemsize = auVar37._16_8_;
                          pMVar23->elempack = auVar37._24_4_;
                          *(int *)&pMVar23->field_0x1c = auVar37._28_4_;
                          pMVar23 = (Mat *)&pMVar23->allocator;
                          iVar28 = iVar28 + -1;
                        } while (iVar28 != 0);
                      }
                      if (0 < (int)uVar8) {
                        iVar28 = 0;
                        pauVar30 = pauVar15;
                        do {
                          auVar37 = *pauVar30;
                          pMVar23->data = (void *)auVar37._0_8_;
                          pMVar23->refcount = (int *)auVar37._8_8_;
                          pMVar23->elemsize = auVar37._16_8_;
                          pMVar23->elempack = auVar37._24_4_;
                          *(int *)&pMVar23->field_0x1c = auVar37._28_4_;
                          pauVar30 = pauVar30 + 1;
                          pMVar23 = (Mat *)&pMVar23->allocator;
                          iVar28 = iVar28 + 1;
                        } while (iVar28 < (int)uVar8);
                      }
                      iVar28 = iVar14;
                      if (0 < iVar14) {
                        do {
                          pMVar23->data = (void *)auVar37._0_8_;
                          pMVar23->refcount = (int *)auVar37._8_8_;
                          pMVar23->elemsize = auVar37._16_8_;
                          pMVar23->elempack = auVar37._24_4_;
                          *(int *)&pMVar23->field_0x1c = auVar37._28_4_;
                          pMVar23 = (Mat *)&pMVar23->allocator;
                          iVar28 = iVar28 + -1;
                        } while (iVar28 != 0);
                      }
                      iVar26 = iVar26 + 1;
                    } while (iVar26 != iVar24);
                  }
                  if (0 < iVar6) {
                    iVar24 = 0;
                    do {
                      auVar37 = *pauVar15;
                      iVar26 = iVar29;
                      if (0 < iVar29) {
                        do {
                          pMVar23->data = (void *)auVar37._0_8_;
                          pMVar23->refcount = (int *)auVar37._8_8_;
                          pMVar23->elemsize = auVar37._16_8_;
                          pMVar23->elempack = auVar37._24_4_;
                          *(int *)&pMVar23->field_0x1c = auVar37._28_4_;
                          pMVar23 = (Mat *)&pMVar23->allocator;
                          iVar26 = iVar26 + -1;
                        } while (iVar26 != 0);
                      }
                      if (0 < (int)uVar8) {
                        iVar26 = 0;
                        do {
                          auVar37 = *pauVar15;
                          pMVar23->data = (void *)auVar37._0_8_;
                          pMVar23->refcount = (int *)auVar37._8_8_;
                          pMVar23->elemsize = auVar37._16_8_;
                          pMVar23->elempack = auVar37._24_4_;
                          *(int *)&pMVar23->field_0x1c = auVar37._28_4_;
                          pauVar15 = pauVar15 + 1;
                          pMVar23 = (Mat *)&pMVar23->allocator;
                          iVar26 = iVar26 + 1;
                        } while (iVar26 < (int)uVar8);
                      }
                      iVar26 = iVar14;
                      if (0 < iVar14) {
                        do {
                          pMVar23->data = (void *)auVar37._0_8_;
                          pMVar23->refcount = (int *)auVar37._8_8_;
                          pMVar23->elemsize = auVar37._16_8_;
                          pMVar23->elempack = auVar37._24_4_;
                          *(int *)&pMVar23->field_0x1c = auVar37._28_4_;
                          pMVar23 = (Mat *)&pMVar23->allocator;
                          iVar26 = iVar26 + -1;
                        } while (iVar26 != 0);
                      }
                      iVar24 = iVar24 + 1;
                    } while (iVar24 < iVar6);
                  }
                  if (0 < iVar27) {
                    iVar24 = 0;
                    do {
                      auVar37 = pauVar15[-(long)(int)uVar8];
                      iVar26 = iVar29;
                      if (0 < iVar29) {
                        do {
                          pMVar23->data = (void *)auVar37._0_8_;
                          pMVar23->refcount = (int *)auVar37._8_8_;
                          pMVar23->elemsize = auVar37._16_8_;
                          pMVar23->elempack = auVar37._24_4_;
                          *(int *)&pMVar23->field_0x1c = auVar37._28_4_;
                          pMVar23 = (Mat *)&pMVar23->allocator;
                          iVar26 = iVar26 + -1;
                        } while (iVar26 != 0);
                      }
                      if (0 < (int)uVar8) {
                        iVar26 = 0;
                        pauVar30 = pauVar15 + -(long)(int)uVar8;
                        do {
                          auVar37 = *pauVar30;
                          pMVar23->data = (void *)auVar37._0_8_;
                          pMVar23->refcount = (int *)auVar37._8_8_;
                          pMVar23->elemsize = auVar37._16_8_;
                          pMVar23->elempack = auVar37._24_4_;
                          *(int *)&pMVar23->field_0x1c = auVar37._28_4_;
                          pauVar30 = pauVar30 + 1;
                          pMVar23 = (Mat *)&pMVar23->allocator;
                          iVar26 = iVar26 + 1;
                        } while (iVar26 < (int)uVar8);
                      }
                      iVar26 = iVar14;
                      if (0 < iVar14) {
                        do {
                          pMVar23->data = (void *)auVar37._0_8_;
                          pMVar23->refcount = (int *)auVar37._8_8_;
                          pMVar23->elemsize = auVar37._16_8_;
                          pMVar23->elempack = auVar37._24_4_;
                          *(int *)&pMVar23->field_0x1c = auVar37._28_4_;
                          pMVar23 = (Mat *)&pMVar23->allocator;
                          iVar26 = iVar26 + -1;
                        } while (iVar26 != 0);
                      }
                      iVar24 = iVar24 + 1;
                    } while (iVar24 != iVar27);
                  }
                }
                p_Var18 = pp_Var9[-3];
                if (*(int *)(&this->field_0xe0 + (long)p_Var18) == 2) {
                  iVar24 = *(int *)(&this->field_0xd0 + (long)p_Var18);
                  iVar27 = *(int *)(&this->field_0xd4 + (long)p_Var18);
                  uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var18);
                  uVar10 = (ulong)uVar22;
                  uVar3 = *(uint *)(&this->field_0xdc + (long)p_Var18);
                  uVar17 = (ulong)uVar3;
                  pauVar19 = (undefined1 (*) [32])(*pauVar19 + (long)(int)(iVar24 * uVar8 * 8) * 4);
                  if (0 < iVar24) {
                    iVar29 = 0;
                    do {
                      lVar12 = uVar10 << 5;
                      if (0 < (int)uVar22) {
                        do {
                          *(undefined1 (*) [32])pMVar21 = *(undefined1 (*) [32])(*pauVar19 + lVar12)
                          ;
                          pMVar21 = (Mat *)&pMVar21->allocator;
                          lVar12 = lVar12 + -0x20;
                        } while (lVar12 != 0);
                      }
                      pauVar15 = pauVar19;
                      if (0 < (int)uVar8) {
                        iVar14 = 0;
                        do {
                          *(undefined1 (*) [32])pMVar21 = *pauVar15;
                          pauVar15 = pauVar15 + 1;
                          pMVar21 = (Mat *)&pMVar21->allocator;
                          iVar14 = iVar14 + 1;
                        } while (iVar14 < (int)uVar8);
                      }
                      if (0 < (int)uVar3) {
                        lVar12 = -0x40;
                        do {
                          *(undefined1 (*) [32])pMVar21 = *(undefined1 (*) [32])(*pauVar15 + lVar12)
                          ;
                          pMVar21 = (Mat *)&pMVar21->allocator;
                          lVar1 = uVar17 * 0x20 + lVar12;
                          lVar12 = lVar12 + -0x20;
                        } while (lVar1 != -0x20);
                      }
                      pauVar19 = (undefined1 (*) [32])((long)pauVar19 + (long)(int)(uVar8 * 8) * -4)
                      ;
                      iVar29 = iVar29 + 1;
                    } while (iVar29 != iVar24);
                  }
                  if (0 < iVar6) {
                    iVar24 = 0;
                    do {
                      lVar12 = uVar10 << 5;
                      if (0 < (int)uVar22) {
                        do {
                          *(undefined1 (*) [32])pMVar21 = *(undefined1 (*) [32])(*pauVar19 + lVar12)
                          ;
                          pMVar21 = (Mat *)&pMVar21->allocator;
                          lVar12 = lVar12 + -0x20;
                        } while (lVar12 != 0);
                      }
                      if (0 < (int)uVar8) {
                        iVar29 = 0;
                        do {
                          *(undefined1 (*) [32])pMVar21 = *pauVar19;
                          pauVar19 = pauVar19 + 1;
                          pMVar21 = (Mat *)&pMVar21->allocator;
                          iVar29 = iVar29 + 1;
                        } while (iVar29 < (int)uVar8);
                      }
                      if (0 < (int)uVar3) {
                        lVar12 = -0x40;
                        do {
                          *(undefined1 (*) [32])pMVar21 = *(undefined1 (*) [32])(*pauVar19 + lVar12)
                          ;
                          pMVar21 = (Mat *)&pMVar21->allocator;
                          lVar1 = uVar17 * 0x20 + lVar12;
                          lVar12 = lVar12 + -0x20;
                        } while (lVar1 != -0x20);
                      }
                      iVar24 = iVar24 + 1;
                    } while (iVar24 < iVar6);
                  }
                  if (0 < iVar27) {
                    uVar11 = (ulong)(int)uVar8;
                    pauVar19 = pauVar19 + uVar11 * -2;
                    iVar6 = 0;
                    do {
                      lVar12 = uVar10 << 5;
                      if (0 < (int)uVar22) {
                        do {
                          *(undefined1 (*) [32])pMVar21 = *(undefined1 (*) [32])(*pauVar19 + lVar12)
                          ;
                          pMVar21 = (Mat *)&pMVar21->allocator;
                          lVar12 = lVar12 + -0x20;
                        } while (lVar12 != 0);
                        uVar11 = (ulong)uVar8;
                      }
                      pauVar15 = pauVar19;
                      if (0 < (int)uVar11) {
                        iVar24 = 0;
                        do {
                          *(undefined1 (*) [32])pMVar21 = *pauVar15;
                          pauVar15 = pauVar15 + 1;
                          pMVar21 = (Mat *)&pMVar21->allocator;
                          iVar24 = iVar24 + 1;
                          uVar11 = (ulong)uVar8;
                        } while (iVar24 < (int)uVar8);
                      }
                      if (0 < (int)uVar3) {
                        lVar12 = -0x40;
                        do {
                          *(undefined1 (*) [32])pMVar21 = *(undefined1 (*) [32])(*pauVar15 + lVar12)
                          ;
                          pMVar21 = (Mat *)&pMVar21->allocator;
                          lVar1 = uVar17 * 0x20 + lVar12;
                          lVar12 = lVar12 + -0x20;
                        } while (lVar1 != -0x20);
                        uVar11 = (ulong)uVar8;
                      }
                      pauVar19 = (undefined1 (*) [32])
                                 ((long)pauVar19 + (long)((int)uVar11 * 8) * -4);
                      iVar6 = iVar6 + 1;
                    } while (iVar6 != iVar27);
                  }
                }
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != (uint)((int)uVar33 >> 3));
            return 0;
          }
        }
        break;
      case 4:
        if (*(int *)(&this->field_0xe0 + (long)p_Var18) == 0) {
          uVar8 = *(int *)(&this->field_0xe8 + (long)p_Var18) + iVar27 +
                  *(int *)(&this->field_0xec + (long)p_Var18);
          pAVar38 = opt->blob_allocator;
          Mat::create(top_blob,iVar32 + *(int *)(&this->field_0xd8 + (long)p_Var18) +
                               *(int *)(&this->field_0xdc + (long)p_Var18),
                      uVar22 + iVar24 + *(int *)(&this->field_0xd4 + (long)p_Var18),uVar8,uVar25,
                      uVar13,8,pAVar38);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            if ((int)uVar25 < 1) {
              return 0;
            }
            uVar10 = (ulong)uVar8;
            uVar13 = 0;
            do {
              p_Var18 = this->_vptr_Padding_x86_avx[-3];
              if (*(int *)(&this->field_0xf0 + (long)p_Var18) == 0) {
                uVar2 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var18);
                auVar37._4_4_ = uVar2;
                auVar37._0_4_ = uVar2;
                auVar37._8_4_ = uVar2;
                auVar37._12_4_ = uVar2;
                auVar37._16_4_ = uVar2;
                auVar37._20_4_ = uVar2;
                auVar37._24_4_ = uVar2;
                auVar37._28_4_ = uVar2;
              }
              else {
                auVar37 = *(undefined1 (*) [32])
                           (*(long *)(&this->field_0xf8 + (long)p_Var18) + uVar13 * 0x20);
              }
              pPVar39 = this;
              if (0 < (int)uVar8) {
                uVar17 = 0;
                do {
                  uVar11 = (long)top_blob->h * (long)top_blob->w;
                  pMVar21 = (Mat *)((long)top_blob->data +
                                   top_blob->elemsize * uVar17 * uVar11 +
                                   top_blob->cstep * uVar13 * top_blob->elemsize);
                  p_Var18 = this->_vptr_Padding_x86_avx[-3];
                  uVar22 = (int)uVar17 - *(int *)(&this->field_0xe8 + (long)p_Var18);
                  if ((int)uVar22 < 0 || iVar27 <= (int)uVar22) {
                    if (0 < (int)uVar11) {
                      do {
                        pMVar21->data = (void *)auVar37._0_8_;
                        pMVar21->refcount = (int *)auVar37._8_8_;
                        pMVar21->elemsize = auVar37._16_8_;
                        pMVar21->elempack = auVar37._24_4_;
                        *(int *)&pMVar21->field_0x1c = auVar37._28_4_;
                        pMVar21 = (Mat *)&pMVar21->allocator;
                        uVar22 = (int)uVar11 - 1;
                        uVar11 = (ulong)uVar22;
                      } while (uVar22 != 0);
                    }
                  }
                  else {
                    v_01._8_8_ = pPVar39;
                    v_01._0_8_ = pAVar38;
                    v_01[4] = (float)in_stack_fffffffffffffef0;
                    v_01[5] = (float)uVar8;
                    v_01._24_8_ = (long)bottom_blob->data +
                                  (long)bottom_blob->h * (long)bottom_blob->w *
                                  bottom_blob->elemsize * (ulong)uVar22 +
                                  bottom_blob->cstep * uVar13 * bottom_blob->elemsize;
                    pPVar40 = pPVar39;
                    padding_constant_pack8_avx
                              ((ncnn *)&stack0xfffffffffffffef8,pMVar21,(Mat *)(long)top_blob->w,
                               *(int *)(&pPVar39->field_0xd0 + (long)p_Var18),
                               *(int *)(&pPVar39->field_0xd4 + (long)p_Var18),
                               *(int *)(&pPVar39->field_0xd8 + (long)p_Var18),
                               *(int *)(&pPVar39->field_0xdc + (long)p_Var18),v_01);
                    this = pPVar39;
                    pPVar39 = pPVar40;
                  }
                  uVar17 = uVar17 + 1;
                } while (uVar17 != uVar10);
              }
              uVar13 = uVar13 + 1;
              this = pPVar39;
            } while (uVar13 != uVar25);
            return 0;
          }
          return -100;
        }
      }
    }
  }
  piVar4 = bottom_blob->refcount;
  __ptr = bottom_blob->data;
  piVar5 = bottom_blob->refcount;
  pAVar38 = bottom_blob->allocator;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  if (iVar6 != 1) {
    local_78.lightmode = opt->lightmode;
    local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
    local_78.num_threads = opt->num_threads;
    local_78.workspace_allocator = opt->workspace_allocator;
    local_78.openmp_blocktime = opt->openmp_blocktime;
    local_78.use_winograd_convolution = opt->use_winograd_convolution;
    local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
    local_78.use_int8_inference = opt->use_int8_inference;
    local_78.use_vulkan_compute = opt->use_vulkan_compute;
    local_78.use_bf16_storage = opt->use_bf16_storage;
    local_78.use_fp16_packed = opt->use_fp16_packed;
    local_78.use_fp16_storage = opt->use_fp16_storage;
    local_78.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    local_78.use_int8_packed = opt->use_int8_packed;
    local_78.use_int8_storage = opt->use_int8_storage;
    local_78.use_int8_arithmetic = opt->use_int8_arithmetic;
    local_78.use_packing_layout = opt->use_packing_layout;
    local_78.use_shader_pack8 = opt->use_shader_pack8;
    local_78.use_subgroup_basic = opt->use_subgroup_basic;
    local_78.use_subgroup_vote = opt->use_subgroup_vote;
    local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
    local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    local_78.use_image_storage = opt->use_image_storage;
    local_78.use_tensor_storage = opt->use_tensor_storage;
    local_78.use_reserved_0 = opt->use_reserved_0;
    local_78.flush_denormals = opt->flush_denormals;
    local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
    local_78.use_shader_local_memory = opt->use_shader_local_memory;
    local_78.use_cooperative_matrix = opt->use_cooperative_matrix;
    local_78.use_winograd23_convolution = opt->use_winograd23_convolution;
    local_78.use_winograd43_convolution = opt->use_winograd43_convolution;
    local_78.use_winograd63_convolution = opt->use_winograd63_convolution;
    local_78.use_reserved_6 = opt->use_reserved_6;
    local_78.use_reserved_7 = opt->use_reserved_7;
    local_78.use_reserved_8 = opt->use_reserved_8;
    local_78.use_reserved_9 = opt->use_reserved_9;
    local_78.use_reserved_10 = opt->use_reserved_10;
    local_78.use_reserved_11 = opt->use_reserved_11;
    local_78.blob_allocator = opt->workspace_allocator;
    convert_packing(bottom_blob,(Mat *)&stack0xfffffffffffffef8,1,&local_78);
  }
  iVar6 = Padding::forward((Padding *)
                           ((long)&this->_vptr_Padding_x86_avx +
                           (long)this->_vptr_Padding_x86_avx[-3]),(Mat *)&stack0xfffffffffffffef8,
                           top_blob,opt);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (pAVar38 == (Allocator *)0x0) {
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
      }
      else {
        (*pAVar38->_vptr_Allocator[3])();
      }
    }
  }
  return iVar6;
}

Assistant:

int Padding_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 16 == 0 ? 16 : outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, 0, 0, left / 16, right / 16, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, top / 16, bottom / 16, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 16 == 0 && out_elempack == 16 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack16_avx512(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack16_avx512(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}